

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

void __thiscall wasm::TypeBuilder::Impl::Entry::Entry(Entry *this)

{
  pointer __p;
  HeapTypeInfo local_68;
  
  (this->info)._M_t.
  super___uniq_ptr_impl<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  .super__Head_base<0UL,_wasm::(anonymous_namespace)::HeapTypeInfo_*,_false>._M_head_impl =
       (HeapTypeInfo *)0x0;
  this->initialized = false;
  __p = (pointer)operator_new(0x40);
  __p->isTemp = false;
  __p->isFinalized = true;
  __p->supertype = (HeapTypeInfo *)0x0;
  __p->recGroup = (RecGroupInfo *)0x0;
  __p->recGroupIndex = 0;
  __p->kind = SignatureKind;
  (__p->field_6).struct_.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->field_6).struct_.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  __uniq_ptr_impl<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  ::reset((__uniq_ptr_impl<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
           *)this,__p);
  local_68.isTemp = false;
  local_68.isFinalized = true;
  local_68.supertype = (HeapTypeInfo *)0x0;
  local_68.recGroup = (RecGroupInfo *)0x0;
  local_68.recGroupIndex = 0;
  local_68.kind = SignatureKind;
  local_68.field_6.struct_.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.field_6.struct_.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  set(this,&local_68);
  anon_unknown_0::HeapTypeInfo::~HeapTypeInfo(&local_68);
  this->initialized = false;
  return;
}

Assistant:

Entry() {
      // We need to eagerly allocate the HeapTypeInfo so we have a TypeID to use
      // to refer to it before it is initialized. Arbitrarily choose a default
      // value.
      info = std::make_unique<HeapTypeInfo>(Signature());
      set(Signature());
      initialized = false;
    }